

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

AppendResult __thiscall
metaf::WindGroup::append
          (WindGroup *this,string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  AppendResult AVar1;
  
  AVar1 = (*(code *)(&DAT_002400f4 + *(int *)(&DAT_002400f4 + (ulong)this->incompleteText * 4)))();
  return AVar1;
}

Assistant:

AppendResult WindGroup::append(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportPart; (void)reportMetadata;
	//Append variable wind sector group to surface wind group
	switch (incompleteText) {
		case IncompleteText::NONE:
		switch (type()) {
			case Type::SURFACE_WIND: return appendVariableSector(group);
			case Type::WIND_SHIFT: return appendWindShift(group, reportMetadata);
			default: return AppendResult::NOT_APPENDED;
		}
		
		case IncompleteText::PK:
		if (group != "WND") return AppendResult::GROUP_INVALIDATED;
		incompleteText = IncompleteText::PK_WND;
		return AppendResult::APPENDED;		

		case IncompleteText::PK_WND:
		return appendPeakWind(group, reportMetadata);

		case IncompleteText::WND:
		if (group != "MISG") return AppendResult::GROUP_INVALIDATED;
		incompleteText = IncompleteText::NONE;
		return AppendResult::APPENDED;

		case IncompleteText::WS_ALL:
		if (group != "RWY") return AppendResult::GROUP_INVALIDATED;
		incompleteText = IncompleteText::NONE;
		rw = Runway::makeAllRunways();
		return AppendResult::APPENDED;

		case IncompleteText::WS:
		if (group == "ALL") {
			incompleteText =  IncompleteText::WS_ALL;
			return AppendResult::APPENDED;
		}
		if (const auto r = Runway::fromString(group, true); r.has_value()) {
			incompleteText = IncompleteText::NONE;
			rw = r;
			return AppendResult::APPENDED;
		}
		return AppendResult::GROUP_INVALIDATED;
	}
}